

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O3

void GenCodeCmdDivd(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  bool bVar1;
  x86XmmReg reg;
  x86XmmReg xVar2;
  uint uVar3;
  
  uVar3 = (uint)((ulong)cmd >> 0xd) & 0x7f8;
  reg = CodeGenGenericContext::FindXmmRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rEBX,uVar3,true);
  if (reg == rXmmRegCount) {
    reg = CodeGenGenericContext::GetXmmReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_movsd,reg,sQWORD,rEBX,uVar3);
  }
  else {
    CodeGenGenericContext::LockXmmReg(&ctx->ctx,reg);
  }
  uVar3 = cmd.argument;
  if ((cmd._0_4_ & 0xff000000) == 0x3000000) {
    bVar1 = CodeGenGenericContext::IsLastRegVmRegisterUse
                      (&ctx->ctx,(uchar)((ulong)cmd >> 0x23),
                       ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    if (bVar1) {
      xVar2 = CodeGenGenericContext::FindXmmRegAtMemory(&ctx->ctx,sQWORD,rNONE,1,rEBX,uVar3,true);
      if (xVar2 == rXmmRegCount) {
        EMIT_OP_REG_RPTR(&ctx->ctx,o_divsd,reg,sQWORD,rEBX,uVar3);
        goto LAB_001e32ed;
      }
    }
  }
  xVar2 = GenCodeLoadDoubleFromPointerIntoRegister(ctx,rEAX,cmd.rC,uVar3);
  EMIT_OP_REG_REG(&ctx->ctx,o_divsd,reg,xVar2);
LAB_001e32ed:
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_movsd,sQWORD,rEBX,cmd._0_4_ >> 5 & 0x7f8,reg);
  return;
}

Assistant:

void GenCodeCmdDivd(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	x86XmmReg lhs = ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rREG, cmd.rB * 8, true);

	if(lhs == rXmmRegCount)
	{
		lhs = ctx.ctx.GetXmmReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_movsd, lhs, sQWORD, rREG, cmd.rB * 8); // Load double value
	}
	else
	{
		ctx.ctx.LockXmmReg(lhs);
	}

	if(cmd.rC == rvrrRegisters && ctx.ctx.IsLastRegVmRegisterUse((unsigned char)(cmd.argument / 8), ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset) && ctx.ctx.FindXmmRegAtMemory(sQWORD, rNONE, 1, rREG, cmd.argument, true) == rXmmRegCount)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_divsd, lhs, sQWORD, rREG, cmd.argument);
	}
	else
	{
		x86XmmReg rhs = GenCodeLoadDoubleFromPointerIntoRegister(ctx, rRAX, cmd.rC, cmd.argument);

		EMIT_OP_REG_REG(ctx.ctx, o_divsd, lhs, rhs);
	}

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_RPTR_REG(ctx.ctx, o_movsd, sQWORD, rREG, cmd.rA * 8, lhs); // Store double to target
}